

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

void fld_mul(limb_t *res,limb_t *a,limb_t *b)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long *in_RDX;
  long *in_RSI;
  ulong uVar43;
  ulong *in_RDI;
  llimb_t c [5];
  limb_t tmp;
  limb_t a19_4;
  limb_t a19_3;
  limb_t a19_2;
  limb_t a19_1;
  
  lVar21 = in_RSI[2] * 0x13;
  lVar1 = in_RSI[3] * 0x13;
  lVar2 = in_RSI[4] * 0x13;
  uVar3 = *in_RSI * *in_RDX;
  uVar4 = in_RSI[1] * 0x13 * in_RDX[4];
  uVar22 = uVar3 + uVar4;
  uVar5 = lVar21 * in_RDX[3];
  uVar23 = uVar22 + uVar5;
  uVar6 = lVar1 * in_RDX[2];
  uVar24 = uVar23 + uVar6;
  uVar7 = lVar2 * in_RDX[1];
  uVar25 = uVar24 + uVar7;
  lVar8 = SUB168(SEXT816(*in_RSI) * SEXT816(*in_RDX),8) +
          SUB168(SEXT816(in_RSI[1] * 0x13) * SEXT816(in_RDX[4]),8) + (ulong)CARRY8(uVar3,uVar4) +
          SUB168(SEXT816(lVar21) * SEXT816(in_RDX[3]),8) + (ulong)CARRY8(uVar22,uVar5) +
          SUB168(SEXT816(lVar1) * SEXT816(in_RDX[2]),8) + (ulong)CARRY8(uVar23,uVar6) +
          SUB168(SEXT816(lVar2) * SEXT816(in_RDX[1]),8) + (ulong)CARRY8(uVar24,uVar7);
  uVar3 = *in_RSI * in_RDX[1];
  uVar4 = in_RSI[1] * *in_RDX;
  uVar26 = uVar3 + uVar4;
  uVar5 = lVar21 * in_RDX[4];
  uVar27 = uVar26 + uVar5;
  uVar6 = lVar1 * in_RDX[3];
  uVar28 = uVar27 + uVar6;
  uVar7 = lVar2 * in_RDX[2];
  uVar29 = uVar28 + uVar7;
  uVar22 = *in_RSI * in_RDX[2];
  uVar23 = in_RSI[1] * in_RDX[1];
  uVar30 = uVar22 + uVar23;
  uVar24 = in_RSI[2] * *in_RDX;
  uVar31 = uVar30 + uVar24;
  uVar9 = lVar1 * in_RDX[4];
  uVar32 = uVar31 + uVar9;
  uVar10 = lVar2 * in_RDX[3];
  uVar33 = uVar32 + uVar10;
  uVar11 = *in_RSI * in_RDX[3];
  uVar12 = in_RSI[1] * in_RDX[2];
  uVar34 = uVar11 + uVar12;
  uVar13 = in_RSI[2] * in_RDX[1];
  uVar35 = uVar34 + uVar13;
  uVar14 = in_RSI[3] * *in_RDX;
  uVar36 = uVar35 + uVar14;
  uVar15 = lVar2 * in_RDX[4];
  uVar37 = uVar36 + uVar15;
  uVar16 = *in_RSI * in_RDX[4];
  uVar17 = in_RSI[1] * in_RDX[3];
  uVar38 = uVar16 + uVar17;
  uVar18 = in_RSI[2] * in_RDX[2];
  uVar39 = uVar38 + uVar18;
  uVar19 = in_RSI[3] * in_RDX[1];
  uVar40 = uVar39 + uVar19;
  uVar20 = in_RSI[4] * *in_RDX;
  uVar41 = uVar40 + uVar20;
  uVar43 = lVar8 * 0x2000 | uVar25 >> 0x33;
  uVar42 = uVar29 + uVar43;
  lVar21 = SUB168(SEXT816(*in_RSI) * SEXT816(in_RDX[1]),8) +
           SUB168(SEXT816(in_RSI[1]) * SEXT816(*in_RDX),8) + (ulong)CARRY8(uVar3,uVar4) +
           SUB168(SEXT816(lVar21) * SEXT816(in_RDX[4]),8) + (ulong)CARRY8(uVar26,uVar5) +
           SUB168(SEXT816(lVar1) * SEXT816(in_RDX[3]),8) + (ulong)CARRY8(uVar27,uVar6) +
           SUB168(SEXT816(lVar2) * SEXT816(in_RDX[2]),8) + (ulong)CARRY8(uVar28,uVar7) +
           (lVar8 >> 0x33) + (ulong)CARRY8(uVar29,uVar43);
  uVar4 = lVar21 * 0x2000 | uVar42 >> 0x33;
  uVar3 = uVar33 + uVar4;
  lVar21 = SUB168(SEXT816(*in_RSI) * SEXT816(in_RDX[2]),8) +
           SUB168(SEXT816(in_RSI[1]) * SEXT816(in_RDX[1]),8) + (ulong)CARRY8(uVar22,uVar23) +
           SUB168(SEXT816(in_RSI[2]) * SEXT816(*in_RDX),8) + (ulong)CARRY8(uVar30,uVar24) +
           SUB168(SEXT816(lVar1) * SEXT816(in_RDX[4]),8) + (ulong)CARRY8(uVar31,uVar9) +
           SUB168(SEXT816(lVar2) * SEXT816(in_RDX[3]),8) + (ulong)CARRY8(uVar32,uVar10) +
           (lVar21 >> 0x33) + (ulong)CARRY8(uVar33,uVar4);
  uVar5 = lVar21 * 0x2000 | uVar3 >> 0x33;
  uVar4 = uVar37 + uVar5;
  lVar21 = SUB168(SEXT816(*in_RSI) * SEXT816(in_RDX[3]),8) +
           SUB168(SEXT816(in_RSI[1]) * SEXT816(in_RDX[2]),8) + (ulong)CARRY8(uVar11,uVar12) +
           SUB168(SEXT816(in_RSI[2]) * SEXT816(in_RDX[1]),8) + (ulong)CARRY8(uVar34,uVar13) +
           SUB168(SEXT816(in_RSI[3]) * SEXT816(*in_RDX),8) + (ulong)CARRY8(uVar35,uVar14) +
           SUB168(SEXT816(lVar2) * SEXT816(in_RDX[4]),8) + (ulong)CARRY8(uVar36,uVar15) +
           (lVar21 >> 0x33) + (ulong)CARRY8(uVar37,uVar5);
  uVar6 = lVar21 * 0x2000 | uVar4 >> 0x33;
  uVar5 = uVar41 + uVar6;
  uVar6 = (uVar25 & 0x7ffffffffffff) +
          ((SUB168(SEXT816(*in_RSI) * SEXT816(in_RDX[4]),8) +
            SUB168(SEXT816(in_RSI[1]) * SEXT816(in_RDX[3]),8) + (ulong)CARRY8(uVar16,uVar17) +
            SUB168(SEXT816(in_RSI[2]) * SEXT816(in_RDX[2]),8) + (ulong)CARRY8(uVar38,uVar18) +
            SUB168(SEXT816(in_RSI[3]) * SEXT816(in_RDX[1]),8) + (ulong)CARRY8(uVar39,uVar19) +
            SUB168(SEXT816(in_RSI[4]) * SEXT816(*in_RDX),8) + (ulong)CARRY8(uVar40,uVar20) +
            (lVar21 >> 0x33) + (ulong)CARRY8(uVar41,uVar6)) * 0x2000 | uVar5 >> 0x33) * 0x13;
  in_RDI[1] = (uVar42 & 0x7ffffffffffff) + ((long)uVar6 >> 0x33);
  *in_RDI = uVar6 & 0x7ffffffffffff;
  in_RDI[2] = uVar3 & 0x7ffffffffffff;
  in_RDI[3] = uVar4 & 0x7ffffffffffff;
  in_RDI[4] = uVar5 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_mul(fld_t res, const fld_t a, const fld_t b)
{
	limb_t a19_1, a19_2, a19_3, a19_4, tmp;
	llimb_t c[5];

	a19_1 = 19*a[1];
	a19_2 = 19*a[2];
	a19_3 = 19*a[3];
	a19_4 = 19*a[4];

	c[0] = (llimb_t)a[0]*b[0] + (llimb_t)a19_1*b[4] + (llimb_t)a19_2*b[3]
		+ (llimb_t)a19_3*b[2] + (llimb_t)a19_4*b[1];
	c[1] = (llimb_t)a[0]*b[1] + (llimb_t)a[1]*b[0] + (llimb_t)a19_2*b[4]
		+ (llimb_t)a19_3*b[3] + (llimb_t)a19_4*b[2];
	c[2] = (llimb_t)a[0]*b[2] + (llimb_t)a[1]*b[1] + (llimb_t)a[2]*b[0]
		+ (llimb_t)a19_3*b[4] + (llimb_t)a19_4*b[3];
	c[3] = (llimb_t)a[0]*b[3] + (llimb_t)a[1]*b[2] + (llimb_t)a[2]*b[1]
		+ (llimb_t)a[3]*b[0] + (llimb_t)a19_4*b[4];
	c[4] = (llimb_t)a[0]*b[4] + (llimb_t)a[1]*b[3] + (llimb_t)a[2]*b[2]
		+ (llimb_t)a[3]*b[1] + (llimb_t)a[4]*b[0];


	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}